

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::ParsedScene::PixelFilter
          (ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  FileLoc loc_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ParameterDictionary dict;
  SceneEntity local_1f8;
  ParameterDictionary local_158;
  ParameterDictionary local_f0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_88;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_88,in_RDX);
  ParameterDictionary::ParameterDictionary(&local_f0,&local_88,this->graphicsState->colorSpace);
  local_88.nStored = 0;
  (*(local_88.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_88.alloc.memoryResource,local_88.ptr,local_88.nAlloc << 3,8);
  if (this->currentApiState == WorldBlock) {
    local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
    local_1f8.name._M_string_length = 0;
    local_1f8.name.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[12]>
              (&local_1f8.name,
               "Options cannot be set inside world block; \"%s\" not allowed.  Ignoring.",
               (char (*) [12])"PixelFilter");
    Error((FileLoc *)&params,local_1f8.name._M_dataplus._M_p);
  }
  else {
    if (this->currentApiState != Uninitialized) {
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::InlinedVector(&local_158.params,&local_f0.params);
      local_158.colorSpace = local_f0.colorSpace;
      loc_00.filename._M_str = (char *)params.ptr;
      loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
      loc_00._16_8_ = params.field_2.fixed[0];
      SceneEntity::SceneEntity(&local_1f8,name,&local_158,loc_00);
      std::__cxx11::string::operator=((string *)&this->filter,(string *)&local_1f8);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::operator=(&(this->filter).parameters.params,&local_1f8.parameters.params);
      (this->filter).parameters.colorSpace = local_1f8.parameters.colorSpace;
      (this->filter).loc.filename._M_len = local_1f8.loc.filename._M_len;
      (this->filter).loc.filename._M_str = local_1f8.loc.filename._M_str;
      (this->filter).loc.line = local_1f8.loc.line;
      (this->filter).loc.column = local_1f8.loc.column;
      local_1f8.parameters.params.nStored = 0;
      (*(local_1f8.parameters.params.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_1f8.parameters.params.alloc.memoryResource,local_1f8.parameters.params.ptr,
                 local_1f8.parameters.params.nAlloc << 3,8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
        operator_delete(local_1f8.name._M_dataplus._M_p,
                        CONCAT71(local_1f8.name.field_2._M_allocated_capacity._1_7_,
                                 local_1f8.name.field_2._M_local_buf[0]) + 1);
      }
      local_158.params.nStored = 0;
      (*(local_158.params.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_158.params.alloc.memoryResource,local_158.params.ptr,
                 local_158.params.nAlloc << 3,8);
      goto LAB_005298f9;
    }
    local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
    local_1f8.name._M_string_length = 0;
    local_1f8.name.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[12]>
              (&local_1f8.name,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [12])"PixelFilter");
    Error((FileLoc *)&params,local_1f8.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
    operator_delete(local_1f8.name._M_dataplus._M_p,
                    CONCAT71(local_1f8.name.field_2._M_allocated_capacity._1_7_,
                             local_1f8.name.field_2._M_local_buf[0]) + 1);
  }
LAB_005298f9:
  local_f0.params.nStored = 0;
  (*(local_f0.params.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_f0.params.alloc.memoryResource,local_f0.params.ptr,local_f0.params.nAlloc << 3,8)
  ;
  return;
}

Assistant:

void ParsedScene::PixelFilter(const std::string &name, ParsedParameterVector params,
                              FileLoc loc) {
    ParameterDictionary dict(std::move(params), graphicsState->colorSpace);
    VERIFY_OPTIONS("PixelFilter");
    filter = SceneEntity(name, std::move(dict), loc);
}